

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void unsetJoinExpr(Expr *p,int iTable,int nullable)

{
  uint uVar1;
  ExprList *pEVar2;
  long lVar3;
  long lVar4;
  
  if (p != (Expr *)0x0) {
    do {
      uVar1 = p->flags;
      if (iTable < 0) {
        uVar1 = uVar1 & 0xfffffffc;
LAB_00188c50:
        p->flags = uVar1;
      }
      else if (((uVar1 & 1) != 0) && ((p->w).iJoin == iTable)) {
        uVar1 = uVar1 & 0xfffffffc | 2;
        goto LAB_00188c50;
      }
      if (p->op == 0xac) {
        pEVar2 = (p->x).pList;
        if ((pEVar2 != (ExprList *)0x0) && (0 < pEVar2->nExpr)) {
          lVar4 = 8;
          lVar3 = 0;
          do {
            unsetJoinExpr(*(Expr **)((long)pEVar2->a + lVar4 + -8),iTable,nullable);
            lVar3 = lVar3 + 1;
            pEVar2 = (p->x).pList;
            lVar4 = lVar4 + 0x18;
          } while (lVar3 < pEVar2->nExpr);
        }
      }
      else if (((p->op == 0xa8) && (nullable == 0)) && (p->iTable == iTable)) {
        p->flags = uVar1 & 0xffdfffff;
      }
      unsetJoinExpr(p->pLeft,iTable,nullable);
      p = p->pRight;
    } while (p != (Expr *)0x0);
  }
  return;
}

Assistant:

static void unsetJoinExpr(Expr *p, int iTable, int nullable){
  while( p ){
    if( iTable<0 || (ExprHasProperty(p, EP_OuterON) && p->w.iJoin==iTable) ){
      ExprClearProperty(p, EP_OuterON|EP_InnerON);
      if( iTable>=0 ) ExprSetProperty(p, EP_InnerON);
    }
    if( p->op==TK_COLUMN && p->iTable==iTable && !nullable ){
      ExprClearProperty(p, EP_CanBeNull);
    }
    if( p->op==TK_FUNCTION ){
      assert( ExprUseXList(p) );
      assert( p->pLeft==0 );
      if( p->x.pList ){
        int i;
        for(i=0; i<p->x.pList->nExpr; i++){
          unsetJoinExpr(p->x.pList->a[i].pExpr, iTable, nullable);
        }
      }
    }
    unsetJoinExpr(p->pLeft, iTable, nullable);
    p = p->pRight;
  }
}